

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_resize.c
# Opt level: O3

void * mpt_queue_resize(mpt_queue *queue,size_t len)

{
  ulong uVar1;
  void *pvVar2;
  size_t len_00;
  
  if (len == 0) {
    free(queue->base);
    queue->max = 0;
    queue->off = 0;
    queue->base = (void *)0x0;
    queue->len = 0;
  }
  else {
    uVar1 = queue->max;
    if (len < uVar1) {
      len_00 = queue->len - len;
      if (len <= queue->len && len_00 != 0) {
        mpt_queue_crop(queue,0,len_00);
      }
      mpt_queue_align(queue,0);
      pvVar2 = realloc(queue->base,len);
      if (pvVar2 == (void *)0x0) {
        return (void *)0x0;
      }
      queue->base = pvVar2;
      queue->max = len;
      return pvVar2;
    }
    if (len <= uVar1) {
      return queue->base;
    }
    if (uVar1 - queue->len < queue->off) {
      mpt_queue_align(queue,0);
    }
    pvVar2 = realloc(queue->base,len);
    if (pvVar2 != (void *)0x0) {
      queue->base = pvVar2;
      queue->max = len;
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

extern void *mpt_queue_resize(MPT_STRUCT(queue) *queue, size_t len)
{
	void *data;
	
	if (!len) {
		free(queue->base);
		queue->base = 0;
		queue->len = queue->off = queue->max = 0;
	}
	/* remove data from queue start */
	else if (len < queue->max) {
		if (len < queue->len) {
			mpt_queue_crop(queue, 0, queue->len - len);
		}
		mpt_queue_align(queue, 0);
		if (!(data = realloc(queue->base, len))) {
			return 0;
		}
		queue->base = data;
		queue->max  = len;
	}
	/* enlarge data area */
	else if (len > queue->max) {
		if (MPT_queue_frag(queue)) {
			mpt_queue_align(queue, 0);
		}
		if (!(data = realloc(queue->base, len))) {
			return 0;
		}
		queue->base = data;
		queue->max  = len;
	}
	return queue->base;
}